

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O1

void __thiscall
UKF::PredictRadarMeasurement
          (UKF *this,MatrixXd *Xsig_pred,MatrixXd *Zsig,VectorXd *z_pred,MatrixXd *S)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 *puVar8;
  undefined1 auVar9 [16];
  double dVar10;
  long lVar11;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  RhsNested pMVar17;
  long lVar18;
  Index index;
  ulong uVar19;
  ActualDstType actualDst;
  double dVar20;
  double dVar21;
  MatrixXd R;
  ActualDstType actualDst_1;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  double local_f8;
  MatrixXd *local_f0;
  double local_e8;
  undefined1 local_e0 [8];
  variable_if_dynamic<long,__1> local_d8;
  scalar_constant_op<double> local_d0;
  MatrixXd *local_c8;
  scalar_constant_op<double> local_c0;
  RhsNested local_b8;
  undefined1 *local_b0;
  RhsNested local_a8;
  double local_98;
  undefined8 uStack_90;
  Scalar local_80;
  double local_78;
  double local_70;
  double local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  double local_48;
  Scalar local_40;
  Scalar local_38;
  
  dVar21 = (double)(ulong)(uint)(z_pred->
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                m_storage.m_rows;
  local_f0 = S;
  if (0 < this->n_sigma_) {
    lVar18 = 0;
    do {
      lVar11 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
      if ((((lVar11 < 1) ||
           ((Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar18)) || (lVar11 < 2)) || ((lVar11 == 2 || (lVar11 < 4)))) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                     );
      }
      pdVar4 = (Xsig_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      lVar11 = lVar11 * lVar18;
      local_f8 = pdVar4[lVar11];
      local_98 = pdVar4[lVar11 + 1];
      local_70 = pdVar4[lVar11 + 2];
      local_e8 = pdVar4[lVar11 + 3];
      local_78 = cos(local_e8);
      local_e8 = sin(local_e8);
      dVar20 = local_f8 * local_f8 + local_98 * local_98;
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      lVar11 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      if ((lVar11 < 1) ||
         ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= lVar18)) {
LAB_00107113:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
      [lVar11 * lVar18] = dVar20;
      dVar20 = atan2(local_98,local_f8);
      lVar11 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      if ((lVar11 < 2) ||
         ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
          <= lVar18)) goto LAB_00107113;
      pdVar4 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      lVar14 = lVar11 * lVar18;
      pdVar4[lVar14 + 1] = dVar20;
      dVar20 = pdVar4[lVar14];
      if ((dVar20 != 0.0) || (NAN(dVar20))) {
        if (lVar11 < 3) goto LAB_00107113;
        dVar20 = (local_f8 * local_78 * local_70 + local_98 * local_e8 * local_70) / dVar20;
      }
      else {
        dVar20 = 0.0;
        if (lVar11 < 3) goto LAB_00107113;
      }
      pdVar4[lVar14 + 2] = dVar20;
      lVar18 = lVar18 + 1;
    } while (lVar18 < this->n_sigma_);
  }
  lVar18 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (lVar18 < 0) {
    pcVar16 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    if (lVar18 != 0) {
      memset((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar18 << 3);
    }
    local_f8 = dVar21;
    if (0 < this->n_sigma_) {
      lVar18 = 0;
      lVar11 = 0;
      do {
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar11) goto LAB_001070f4;
        pdVar4 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        uVar15 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        if ((long)uVar15 < 0 && pdVar4 != (double *)0x0) goto LAB_00107151;
        if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols <= lVar11) goto LAB_00107132;
        if ((long)uVar15 < 0) {
          pcVar16 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_001071bb;
        }
        if ((z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows != uVar15) {
          pcVar16 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
          ;
          goto LAB_001071f1;
        }
        uVar5 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
        if (uVar5 != uVar15) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>, T1 = double, T2 = double]"
                       );
        }
        dVar21 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar11];
        pdVar6 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar7 = (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        uVar19 = uVar5 - ((long)uVar5 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar5) {
          lVar14 = 0;
          do {
            pdVar1 = pdVar6 + lVar14;
            dVar20 = pdVar1[1];
            pdVar2 = (double *)((long)pdVar4 + lVar14 * 8 + uVar15 * lVar18);
            dVar10 = pdVar2[1];
            pdVar3 = pdVar7 + lVar14;
            *pdVar3 = *pdVar2 * dVar21 + *pdVar1;
            pdVar3[1] = dVar10 * dVar21 + dVar20;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar5) {
          do {
            pdVar7[uVar19] =
                 *(double *)((long)pdVar4 + uVar19 * 8 + uVar15 * lVar18) * dVar21 + pdVar6[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar5 != uVar19);
        }
        lVar11 = lVar11 + 1;
        lVar18 = lVar18 + 8;
      } while (lVar11 < this->n_sigma_);
    }
    local_e0 = (undefined1  [8])
               (local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
    local_d8.m_value =
         (local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_cols;
    local_d0.m_other = 0.0;
    if (-1 < (long)(local_d8.m_value | (ulong)local_e0)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_f0,(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           *)local_e0,(assign_op<double,_double> *)&local_118);
      if (0 < this->n_sigma_) {
        pMVar17 = (RhsNested)0x0;
        do {
          pdVar4 = (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data;
          puVar8 = (undefined1 *)
                   (Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
          if ((long)puVar8 < 0 && pdVar4 != (double *)0x0) {
LAB_00107151:
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if ((Zsig->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols <= (long)pMVar17) {
LAB_00107132:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          local_e0 = (undefined1  [8])(pdVar4 + (long)puVar8 * (long)pMVar17);
          local_c0.m_other = 0.0;
          local_d8.m_value = (long)puVar8;
          local_c8 = Zsig;
          local_b8 = pMVar17;
          local_b0 = puVar8;
          local_a8.m_matrix = z_pred;
          if (puVar8 != (undefined1 *)
                        (z_pred->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows) {
            pcVar16 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_001071f1;
          }
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_118,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)local_e0);
          if (local_118.m_rows < 2) {
LAB_001070f4:
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_98 = (double)((ulong)local_118.m_data[1] & 0x8000000000000000 | 0x400921fb54442d18);
          uStack_90 = 0x400921fb54442d18;
          dVar21 = fmod(local_118.m_data[1] + local_98,6.283185307179586);
          if (local_118.m_rows < 2) goto LAB_001070f4;
          local_118.m_data[1] = dVar21 - local_98;
          if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= (long)pMVar17) goto LAB_001070f4;
          local_c0.m_other =
               (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[(long)pMVar17];
          local_e0 = (undefined1  [8])local_f0;
          local_d0.m_other = (double)local_118.m_rows;
          if (((local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows != local_118.m_rows) ||
             ((local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_cols != local_118.m_rows)) {
            pcVar16 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>>]"
            ;
            local_b8 = (RhsNested)&local_118;
            local_a8.m_matrix = (non_const_type)&local_118;
            goto LAB_001071f1;
          }
          local_b8 = (RhsNested)&local_118;
          local_a8.m_matrix = (non_const_type)&local_118;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,0>const>,Eigen::internal::assign_op<double,double>>
                    (local_f0,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                               *)local_e0,(assign_op<double,_double> *)&local_80,(type)0x0);
          free(local_118.m_data);
          pMVar17 = (RhsNested)
                    ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data + 1);
        } while ((long)pMVar17 < (long)this->n_sigma_);
      }
      local_118.m_data = (double *)0x0;
      local_118.m_rows = 0;
      local_118.m_cols = 0;
      uVar15 = (ulong)SUB84(local_f8,0);
      if ((long)uVar15 < 0) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if ((local_f8 != 0.0) &&
         (auVar9._8_8_ = 0, auVar9._0_8_ = uVar15,
         SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar9,0) < (long)uVar15)) {
        puVar13 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar13 = &std::__cxx11::istringstream::VTT;
        __cxa_throw(puVar13,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,uVar15 * uVar15,uVar15,uVar15);
      local_d8.m_value = 0;
      local_d0.m_other = 4.94065645841247e-324;
      local_c8 = (MatrixXd *)0x1;
      if ((local_118.m_rows < 1) || (local_118.m_cols < 1)) {
        local_e0 = (undefined1  [8])&local_118;
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                      "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      *local_118.m_data = this->std_radr_ * this->std_radr_;
      local_80 = 0.0;
      local_e0 = (undefined1  [8])&local_118;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_e0,
                           &local_80);
      local_38 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_38);
      local_40 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_40);
      local_48 = this->std_radphi_ * this->std_radphi_;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_48);
      local_50 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_50);
      local_58 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_58);
      local_60 = 0.0;
      pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar12,&local_60);
      local_68 = this->std_radrd_ * this->std_radrd_;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar12,&local_68);
      if ((((long)&(local_c8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_data + local_d8.m_value != *(long *)((long)local_e0 + 8)) &&
          (*(long *)((long)local_e0 + 0x10) != 0)) ||
         (local_d0.m_other != *(double *)((long)local_e0 + 0x10))) {
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      local_e0 = (undefined1  [8])local_f0;
      if (((local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows == local_118.m_rows) &&
         ((local_f0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols == local_118.m_cols)) {
        local_d8.m_value = (long)&local_118;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
                  (local_f0,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                             *)local_e0,(assign_op<double,_double> *)&local_80);
        free(local_118.m_data);
        return;
      }
      pcVar16 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      local_d8.m_value = (long)&local_118;
LAB_001071f1:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar16);
    }
    pcVar16 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
LAB_001071bb:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar16);
}

Assistant:

void UKF::PredictRadarMeasurement(const MatrixXd &Xsig_pred, MatrixXd &Zsig, VectorXd &z_pred, MatrixXd &S) {

  //set measurement dimension, radar can measure r, phi, and r_dot
  int n_z = z_pred.rows();

  // transform sigma points into measurement space

  for (int i = 0; i < n_sigma_; i++) {

    // extract values for better readability
    double px  = Xsig_pred(0, i);
    double py  = Xsig_pred(1, i);
    double v   = Xsig_pred(2, i);
    double yaw = Xsig_pred(3, i);

    double v1 = cos(yaw) * v;
    double v2 = sin(yaw) * v;

    // measurement model
    Zsig(0, i) = sqrt(px*px + py*py);                  // r
    Zsig(1, i) = atan2(py, px);                        //phi
    if (Zsig(0, i) != 0) {
      Zsig(2, i) = (px * v1 + py * v2) / Zsig(0, i);   //r_dot
    } else {
      Zsig(2, i) = 0;
    }
  }

  // mean predicted measurement
  z_pred.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  // measurement covariance matrix S
  S.fill(0.0);
  for (int i=0; i < n_sigma_; i++) {
    // residual
    VectorXd z_diff = Zsig.col(i) - z_pred;
    z_diff(1) = normalizeRadiansPiToMinusPi(z_diff(1));

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  // add measurement noise covariance matrix to the measurement covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R <<    std_radr_*std_radr_, 0,                       0,
          0,                   std_radphi_*std_radphi_, 0,
          0,                   0,                       std_radrd_*std_radrd_;

  S = S + R;
}